

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void * multi_thread_client_shutdown(void *args)

{
  fdb_kvs_handle *pfVar1;
  fdb_file_handle *pfVar2;
  fdb_custom_cmp_variable __th;
  fdb_doc *doc;
  size_t *psVar3;
  size_t keylen;
  bool bVar4;
  fdb_config *pfVar5;
  fdb_status fVar6;
  int iVar7;
  fdb_config *fconfig;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  uint8_t *puVar10;
  fdb_doc *pfVar11;
  size_t sVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar13;
  fdb_config *in_RCX;
  double *extraout_RDX;
  ulong uVar14;
  long lVar15;
  char **ptr_handle;
  fdb_config *pfVar16;
  fdb_config *pfVar17;
  uint uVar18;
  uint64_t *puVar19;
  uint64_t *puVar20;
  uint64_t *puVar21;
  uint64_t *puVar22;
  uint64_t *puVar23;
  uint64_t *puVar24;
  uint64_t *puVar25;
  char *pcVar26;
  code *pcVar27;
  fdb_config *unaff_R12;
  fdb_config *unaff_R15;
  fdb_config *pfVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  undefined1 auStackY_12b1 [1424];
  undefined1 auStackY_d21 [376];
  undefined1 auStackY_ba9 [233];
  fdb_config fStack_ab0;
  undefined8 uStack_988;
  fdb_config fStack_970;
  fdb_config fStack_7d8;
  fdb_config fStack_6e0;
  undefined1 auStack_5e0 [336];
  undefined1 auStack_490 [416];
  fdb_config fStack_2f0;
  timeval tStack_1f0;
  fdb_kvs_handle *pfStack_1e0;
  uint64_t uStack_1d8;
  uint64_t uStack_1d0;
  ulong uStack_1c8;
  fdb_kvs_handle *pfStack_1c0;
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  fdb_seqnum_t fStack_1a8;
  fdb_config *pfStack_1a0;
  fdb_kvs_handle *pfStack_198;
  fdb_doc *pfStack_190;
  fdb_config *pfStack_188;
  kvs_ops_stat *local_178;
  btree *apbStack_160 [2];
  fdb_config local_150;
  undefined1 local_58 [8];
  timeval __test_begin;
  fdb_file_handle *tdbfile;
  
  pcVar27 = (code *)0x0;
  apbStack_160[0] = (btree *)0x113b84;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  if (args == (void *)0x0) {
    apbStack_160[0] = (btree *)0x113b92;
    memleak_start();
    apbStack_160[0] = (btree *)0x113b9e;
    system("rm -rf  dummy* > errorlog.txt");
    local_150._0_4_ = 0;
    do {
      pthread_create((pthread_t *)(&stack0xfffffffffffffe98 + (long)(int)pcVar27 * 8),
                     (pthread_attr_t *)0x0,multi_thread_client_shutdown,&local_150);
      pcVar27 = (code *)(ulong)(local_150._0_4_ + 1);
      bVar4 = (int)local_150._0_4_ < 1;
      local_150._0_4_ = local_150._0_4_ + 1;
    } while (bVar4);
    local_150._0_4_ = 0;
    do {
      pthread_join(*(pthread_t *)(&stack0xfffffffffffffe98 + (long)(int)local_150._0_4_ * 8),
                   &local_178 + (int)local_150._0_4_);
      uVar29 = local_150._0_4_;
      local_150._0_4_ = local_150._0_4_ + 1;
    } while ((int)uVar29 < 1);
    memleak_end();
    pcVar26 = "%s PASSED\n";
    if (multi_thread_client_shutdown(void*)::__test_pass != '\0') {
      pcVar26 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar26,"multi thread client shutdown");
    return (void *)0x0;
  }
  apbStack_160[0] = (btree *)0x113c73;
  fdb_get_default_config();
  apbStack_160[0] = (btree *)0x113c7c;
  fdb_get_default_kvs_config();
  local_150.wal_threshold = 0x400;
  local_150.compaction_threshold = '\0';
  pfVar28 = (fdb_config *)&__test_begin.tv_usec;
  apbStack_160[0] = (btree *)0x113c9b;
  fVar6 = fdb_open((fdb_file_handle **)pfVar28,"./dummy1",&local_150);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    apbStack_160[0] = (btree *)0x113ca8;
    fVar6 = fdb_close((fdb_file_handle *)__test_begin.tv_usec);
    if (fVar6 != FDB_RESULT_SUCCESS) {
      apbStack_160[0] = (btree *)0x113cb5;
      multi_thread_client_shutdown();
    }
    apbStack_160[0] = (btree *)0x113cba;
    fdb_shutdown();
    apbStack_160[0] = (btree *)0x113cc1;
    pthread_exit((void *)0x0);
  }
  apbStack_160[0] = (btree *)multi_thread_kvs_client;
  multi_thread_client_shutdown();
  puVar19 = (uint64_t *)apbStack_160;
  puVar20 = (uint64_t *)apbStack_160;
  puVar21 = (uint64_t *)apbStack_160;
  puVar22 = (uint64_t *)apbStack_160;
  puVar23 = (uint64_t *)apbStack_160;
  puVar24 = (uint64_t *)apbStack_160;
  puVar25 = (uint64_t *)apbStack_160;
  local_178 = (kvs_ops_stat *)0x0;
  pfVar16 = &fStack_970;
  pfVar17 = &fStack_970;
  pfStack_188 = &local_150;
  apbStack_160[0] = (btree *)&stack0xfffffffffffffff8;
  gettimeofday(&tStack_1f0,(__timezone_ptr_t)0x0);
  pfStack_190 = (fdb_doc *)0x0;
  if (pfVar28 != (fdb_config *)0x0) {
    fconfig = (fdb_config *)(auStack_490 + 0xa0);
    fdb_get_default_config();
    unaff_R15 = &fStack_7d8;
    memcpy(unaff_R15,fconfig,0xf8);
    pfVar9 = (fdb_kvs_handle *)&pfStack_198;
    fVar6 = fdb_open((fdb_file_handle **)pfVar9,"./dummy1",unaff_R15);
    pfVar5 = &fStack_970;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114281;
    uVar18 = *(uint *)pfVar28;
    pfVar28 = (fdb_config *)(auStack_490 + 0xa0);
    sprintf((char *)pfVar28,"db%d",(ulong)uVar18);
    fconfig = &fStack_2f0;
    fdb_get_default_kvs_config();
    in_RCX = (fdb_config *)&pfStack_1c0;
    uStack_1b0 = fStack_2f0.wal_threshold;
    pfStack_1c0 = (fdb_kvs_handle *)fStack_2f0._0_8_;
    uStack_1b8 = fStack_2f0.buffercache_size;
    pfVar9 = pfStack_198;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_198,&pfStack_1e0,(char *)pfVar28,
                         (fdb_kvs_config *)in_RCX);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114286;
    pfVar28 = (fdb_config *)0x0;
    unaff_R15 = (fdb_config *)0x0;
    do {
      sprintf((char *)&fStack_2f0,"key%d",(ulong)unaff_R15 & 0xffffffff);
      sprintf((char *)&fStack_6e0,"meta%d",(ulong)unaff_R15 & 0xffffffff);
      sprintf(auStack_5e0 + 0x50,"body%d",(ulong)unaff_R15 & 0xffffffff);
      pcVar27 = (code *)((long)&pfVar28->chunksize + (long)&fStack_970.chunksize);
      fconfig = (fdb_config *)strlen((char *)&fStack_2f0);
      unaff_R12 = (fdb_config *)strlen((char *)&fStack_6e0);
      sVar8 = strlen(auStack_5e0 + 0x50);
      in_RCX = &fStack_6e0;
      uStack_988 = 0x113e39;
      fdb_doc_create((fdb_doc **)pcVar27,&fStack_2f0,(size_t)fconfig,in_RCX,(size_t)unaff_R12,
                     auStack_5e0 + 0x50,sVar8);
      pfVar9 = pfStack_1e0;
      fVar6 = fdb_set(pfStack_1e0,*(fdb_doc **)(&fStack_970.chunksize + (long)unaff_R15 * 4));
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114263;
      fdb_doc_free(*(fdb_doc **)(&fStack_970.chunksize + (long)unaff_R15 * 4));
      unaff_R15 = (fdb_config *)((long)&unaff_R15->chunksize + 1);
      pfVar28 = (fdb_config *)&pfVar28->buffercache_size;
    } while (unaff_R15 != (fdb_config *)0x32);
    pfVar9 = pfStack_198;
    fVar6 = fdb_commit((fdb_file_handle *)pfStack_198,'\x01');
    pfVar17 = &fStack_970;
    if (fVar6 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_198);
      return (void *)0x0;
    }
    goto LAB_00114290;
  }
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  pfVar28 = (fdb_config *)(auStack_490 + 0xa0);
  fdb_get_default_config();
  fconfig = &fStack_7d8;
  memcpy(fconfig,pfVar28,0xf8);
  fStack_7d8.buffercache_size = 0;
  fStack_7d8.wal_threshold = 0x400;
  fStack_7d8.compaction_threshold = '\0';
  pfVar9 = (fdb_kvs_handle *)&pfStack_198;
  fVar6 = fdb_open((fdb_file_handle **)pfVar9,"./dummy1",fconfig);
  pfVar17 = &fStack_970;
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011428b;
  pfStack_1a0 = (fdb_config *)(fStack_ab0.encryption_key.bytes + 0xc);
  pfVar17 = &fStack_ab0;
  fconfig = (fdb_config *)(auStack_490 + 0xa0);
  pfVar28 = (fdb_config *)&pfStack_1c0;
  unaff_R15 = (fdb_config *)0x0;
  pcVar27 = (code *)0x0;
  do {
    sprintf((char *)fconfig,"db%d",(ulong)pcVar27 & 0xffffffff);
    fdb_get_default_kvs_config();
    uStack_1b0 = fStack_2f0.wal_threshold;
    pfStack_1c0 = (fdb_kvs_handle *)fStack_2f0._0_8_;
    uStack_1b8 = fStack_2f0.buffercache_size;
    in_RCX = pfVar28;
    pfVar9 = pfStack_198;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_198,
                         (fdb_kvs_handle **)(auStack_490 + (long)unaff_R15),(char *)fconfig,
                         (fdb_kvs_config *)pfVar28);
    unaff_R12 = pfVar17;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011426d;
    pfVar9 = *(fdb_kvs_handle **)(auStack_490 + (long)pcVar27 * 8);
    fVar6 = fdb_kvs_close(pfVar9);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114268;
    pcVar27 = (code *)((long)&((fdb_config *)pcVar27)->chunksize + 1);
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
  } while ((fdb_config *)pcVar27 != (fdb_config *)0x14);
  pfVar28 = (fdb_config *)auStack_5e0;
  lVar15 = 0;
  unaff_R15 = pfStack_1a0;
  do {
    *(int *)pfVar28 = (int)lVar15;
    in_RCX = pfVar28;
    pthread_create((pthread_t *)unaff_R15,(pthread_attr_t *)0x0,multi_thread_kvs_client,pfVar28);
    fconfig = pfStack_1a0;
    lVar15 = lVar15 + 1;
    unaff_R15 = (fdb_config *)&unaff_R15->buffercache_size;
    pfVar28 = (fdb_config *)&pfVar28->blocksize;
  } while (lVar15 != 0x14);
  lVar15 = 0;
  do {
    pthread_join(*(pthread_t *)((long)&fconfig->chunksize + lVar15),
                 (void **)((long)&pfVar17->chunksize + lVar15));
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0xa0);
  pfVar9 = pfStack_198;
  fVar6 = fdb_commit((fdb_file_handle *)pfStack_198,'\0');
  pcVar27 = (code *)0x14;
  pfVar28 = (fdb_config *)0xa0;
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114295;
  pcVar27 = (code *)&fStack_6e0;
  pfVar28 = (fdb_config *)(auStack_5e0 + 0x50);
  uVar14 = 0;
  do {
    unaff_R15 = &fStack_2f0;
    unaff_R12 = (fdb_config *)(auStack_490 + 0xa0);
    sprintf((char *)unaff_R12,"db%d",uVar14 & 0xffffffff);
    fdb_get_default_kvs_config();
    uStack_1b0 = uStack_1d0;
    pfStack_1c0 = pfStack_1e0;
    uStack_1b8 = uStack_1d8;
    fconfig = (fdb_config *)(auStack_490 + uVar14 * 8);
    in_RCX = (fdb_config *)&pfStack_1c0;
    pfVar9 = pfStack_198;
    uStack_1c8 = uVar14;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfStack_198,(fdb_kvs_handle **)fconfig,(char *)unaff_R12
                         ,(fdb_kvs_config *)in_RCX);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114272;
    pfVar9 = *(fdb_kvs_handle **)fconfig;
    fVar6 = fdb_get_kvs_seqnum(pfVar9,&fStack_1a8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114277;
    if (fStack_1a8 != 0x32) {
      multi_thread_kvs_client();
    }
    unaff_R12 = (fdb_config *)0x0;
    pfStack_1a0 = fconfig;
    do {
      fconfig = pfStack_1a0;
      unaff_R15 = &fStack_2f0;
      sprintf((char *)unaff_R15,"key%d",unaff_R12);
      sprintf((char *)pcVar27,"meta%d",unaff_R12);
      sprintf((char *)pfVar28,"body%d",unaff_R12);
      sVar8 = strlen((char *)unaff_R15);
      in_RCX = (fdb_config *)0x0;
      fdb_doc_create(&pfStack_190,unaff_R15,sVar8,(void *)0x0,0,(void *)0x0,0);
      pfVar9 = *(fdb_kvs_handle **)fconfig;
      fVar6 = fdb_get(pfVar9,pfStack_190);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        multi_thread_kvs_client();
        goto LAB_00114263;
      }
      pvVar13 = pfStack_190->key;
      sVar8 = strlen((char *)unaff_R15);
      iVar7 = bcmp(pvVar13,unaff_R15,sVar8);
      if (iVar7 != 0) {
        multi_thread_kvs_client();
      }
      iVar7 = bcmp(pfStack_190->meta,pcVar27,pfStack_190->metalen);
      if (iVar7 != 0) {
        multi_thread_kvs_client();
      }
      iVar7 = bcmp(pfStack_190->body,pfVar28,pfStack_190->bodylen);
      if (iVar7 != 0) {
        multi_thread_kvs_client();
      }
      fdb_doc_free(pfStack_190);
      fconfig = pfStack_1a0;
      uVar18 = (int)unaff_R12 + 1;
      unaff_R12 = (fdb_config *)(ulong)uVar18;
      unaff_R15 = &fStack_2f0;
    } while (uVar18 != 0x32);
    pfVar9 = *(fdb_kvs_handle **)pfStack_1a0;
    fVar6 = fdb_kvs_close(pfVar9);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011427c;
    uVar14 = uStack_1c8 + 1;
  } while (uVar14 != 0x14);
  fVar6 = fdb_close((fdb_file_handle *)pfStack_198);
  fconfig = (fdb_config *)0x14;
  pfVar9 = pfStack_198;
  if (fVar6 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    if (multi_thread_kvs_client(void*)::__test_pass == '\0') {
      pcVar26 = "%s PASSED\n";
    }
    else {
      pcVar26 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar26,"multi thread kvs client");
    return (void *)0x0;
  }
  goto LAB_0011429a;
LAB_0011468c:
  pfVar17[-2].max_writer_lock_prob = 0x114691;
  multi_thread_fhandle_share();
LAB_00114691:
  pfVar17[-2].max_writer_lock_prob = 0x114696;
  multi_thread_fhandle_share();
LAB_00114696:
  pfVar17[-2].max_writer_lock_prob = 0x11469b;
  multi_thread_fhandle_share();
LAB_0011469b:
  puVar10 = pfVar17[-2].encryption_key.bytes + 4;
  pcVar26 = "key%03d";
  pfVar17[-2].max_writer_lock_prob = 0x1146a0;
  multi_thread_fhandle_share();
  goto LAB_001146a0;
LAB_00114d80:
  pfVar17[-0xb].block_reusing_threshold = 0x114d85;
  custom_compare_primitive_test();
LAB_00114d85:
  pfVar17[-0xb].block_reusing_threshold = 0x114d8a;
  custom_compare_primitive_test();
LAB_00114d8a:
  pfVar17[-0xb].block_reusing_threshold = 0x114d8f;
  custom_compare_primitive_test();
  goto LAB_00114d8f;
LAB_00114263:
  pfVar17[-1].num_blocks_readahead = 0x114268;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_00114268:
  pfVar17[-1].num_blocks_readahead = 0x11426d;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_0011426d:
  pfVar17[-1].num_blocks_readahead = 0x114272;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_00114272:
  pfVar17[-1].num_blocks_readahead = 0x114277;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_00114277:
  pfVar17[-1].num_blocks_readahead = 0x11427c;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_0011427c:
  pfVar17[-1].num_blocks_readahead = 0x114281;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
  pfVar5 = pfVar17;
LAB_00114281:
  pfVar16 = pfVar5;
  *(undefined8 *)((long)pfVar16 + -8) = 0x114286;
  multi_thread_kvs_client();
LAB_00114286:
  *(undefined8 *)((long)pfVar16 + -8) = 0x11428b;
  multi_thread_kvs_client();
  pfVar17 = pfVar16;
LAB_0011428b:
  *(undefined8 *)((long)pfVar17 + -8) = 0x114290;
  multi_thread_kvs_client();
LAB_00114290:
  *(undefined8 *)((long)pfVar17 + -8) = 0x114295;
  multi_thread_kvs_client();
LAB_00114295:
  pfVar17[-1].num_blocks_readahead = 0x11429a;
  pfVar17[-1].bottom_up_index_build = false;
  *(undefined3 *)&pfVar17[-1].field_0xf5 = 0;
  multi_thread_kvs_client();
LAB_0011429a:
  *(code **)&pfVar17[-1].num_blocks_readahead = multi_thread_fhandle_share;
  multi_thread_kvs_client();
  *(btree ***)&pfVar17[-1].num_blocks_readahead = apbStack_160;
  *(fdb_config **)&pfVar17[-1].do_not_move_to_compacted_file = unaff_R15;
  pfVar17[-1].log_msg_level = (size_t)fconfig;
  pfVar17[-1].breakpad_minidump_dir = (char *)pcVar27;
  pfVar17[-1].num_keeping_headers = (size_t)unaff_R12;
  pfVar17[-1].max_block_reusing_cycle = (size_t)pfVar28;
  pfVar17[-2].max_writer_lock_prob = 0x1142bf;
  gettimeofday((timeval *)&pfVar17[-2].block_reusing_threshold,(__timezone_ptr_t)0x0);
  if (pfVar9 != (fdb_kvs_handle *)0x0) {
    if (*(char *)&pfVar9->op_stats == '\0') {
      if (((ulong)pfVar9->op_stats & 0x100) == 0) {
        puVar10 = pfVar17[-2].encryption_key.bytes + 4;
        unaff_R12 = (fdb_config *)&pfVar17[-2].max_block_reusing_cycle;
        pcVar27 = (code *)&pfVar17[-2].enable_background_compactor;
        puVar19 = (uint64_t *)0x0;
        do {
          pfVar17[-2].max_block_reusing_cycle = 0;
          pfVar17[-2].max_writer_lock_prob = 0x1143ad;
          sprintf((char *)puVar10,"key%03d",puVar19);
          pfVar1 = (fdb_kvs_handle *)(pfVar9->kvs_config).custom_cmp_param;
          pfVar17[-2].max_writer_lock_prob = 0x1143c4;
          in_RCX = unaff_R12;
          fVar6 = fdb_get_kv(pfVar1,puVar10,7,(void **)unaff_R12,(size_t *)pcVar27);
          if (fVar6 == FDB_RESULT_HANDLE_BUSY) {
            pfVar17[-2].max_writer_lock_prob = 0x114682;
            multi_thread_fhandle_share();
LAB_00114682:
            pfVar17[-2].max_writer_lock_prob = 0x114687;
            multi_thread_fhandle_share();
LAB_00114687:
            pfVar17[-2].max_writer_lock_prob = 0x11468c;
            multi_thread_fhandle_share();
            goto LAB_0011468c;
          }
          pfVar1 = (fdb_kvs_handle *)pfVar9->kvs;
          pfVar17[-2].max_writer_lock_prob = 0x1143e4;
          in_RCX = unaff_R12;
          fVar6 = fdb_get_kv(pfVar1,puVar10,7,(void **)unaff_R12,(size_t *)pcVar27);
          if (fVar6 == FDB_RESULT_HANDLE_BUSY) goto LAB_00114682;
          pfVar1 = (fdb_kvs_handle *)(pfVar9->kvs_config).custom_cmp;
          pfVar17[-2].max_writer_lock_prob = 0x114404;
          in_RCX = unaff_R12;
          fVar6 = fdb_get_kv(pfVar1,puVar10,7,(void **)unaff_R12,(size_t *)pcVar27);
          if (fVar6 == FDB_RESULT_HANDLE_BUSY) goto LAB_00114687;
          uVar18 = (int)puVar19 + 1;
          puVar19 = (uint64_t *)(ulong)uVar18;
        } while ((uVar18 != 2000) ||
                (puVar19 = (uint64_t *)0x0, ((ulong)pfVar9->op_stats & 0x100) == 0));
      }
    }
    else {
      puVar10 = pfVar17[-2].encryption_key.bytes + 4;
      puVar19 = (uint64_t *)0x0;
      do {
        pfVar17[-2].max_writer_lock_prob = 0x1142ef;
        sprintf((char *)puVar10,"key%03d",puVar19);
        pfVar1 = (fdb_kvs_handle *)(pfVar9->kvs_config).custom_cmp_param;
        in_RCX = (fdb_config *)0x0;
        pfVar17[-2].max_writer_lock_prob = 0x114305;
        fVar6 = fdb_set_kv(pfVar1,puVar10,7,(void *)0x0,0);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011469b;
        pfVar1 = (fdb_kvs_handle *)pfVar9->kvs;
        in_RCX = (fdb_config *)0x0;
        pfVar17[-2].max_writer_lock_prob = 0x114323;
        fVar6 = fdb_set_kv(pfVar1,puVar10,7,(void *)0x0,0);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114696;
        pfVar1 = (fdb_kvs_handle *)(pfVar9->kvs_config).custom_cmp;
        in_RCX = (fdb_config *)0x0;
        pfVar17[-2].max_writer_lock_prob = 0x114341;
        fVar6 = fdb_set_kv(pfVar1,puVar10,7,(void *)0x0,0);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114691;
        pfVar2 = *(fdb_file_handle **)&pfVar9->kvs_config;
        pfVar17[-2].max_writer_lock_prob = 0x114356;
        fVar6 = fdb_commit(pfVar2,'\x01');
        if (fVar6 == FDB_RESULT_HANDLE_BUSY) goto LAB_0011468c;
        uVar18 = (int)puVar19 + 1;
        puVar19 = (uint64_t *)(ulong)uVar18;
      } while (uVar18 != 2000);
    }
    return (void *)0x0;
  }
  pfVar17[-2].max_writer_lock_prob = 0x11443a;
  pfVar9 = (fdb_kvs_handle *)malloc(0x10);
  pfVar17[-2].max_writer_lock_prob = 0x114447;
  pcVar26 = (char *)malloc(0x50);
  pfVar17[-2].max_writer_lock_prob = 0x114454;
  puVar10 = (uint8_t *)malloc(0x10);
  pfVar17[-2].max_writer_lock_prob = 0x114463;
  system("rm -rf  func_test* > errorlog.txt");
  unaff_R12 = (fdb_config *)&pfVar17[-2].max_block_reusing_cycle;
  pfVar17[-2].max_writer_lock_prob = 0x114470;
  fdb_get_default_config();
  pfVar17[-2].num_keeping_headers = 0;
  pfVar17[-2].field_0xf7 = 0;
  pfVar17[-1].prefetch_duration = 1;
  pfVar17[-2].max_writer_lock_prob = 0x114492;
  fdb_get_default_kvs_config();
  pcVar27 = (code *)(pfVar17[-2].encryption_key.bytes + 4);
  pfVar17[-2].max_writer_lock_prob = 0x1144aa;
  sprintf((char *)pcVar27,"./func_test_pt.%d",0);
  pfVar17[-2].max_writer_lock_prob = 0x1144b8;
  fVar6 = fdb_open((fdb_file_handle **)&pfVar17[-2].num_compactor_threads,(char *)pcVar27,unaff_R12)
  ;
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfVar2 = (fdb_file_handle *)pfVar17[-2].num_compactor_threads;
    *(fdb_file_handle **)pcVar26 = pfVar2;
    *(fdb_file_handle **)(pcVar26 + 0x28) = pfVar2;
    pcVar26[0x20] = '\x01';
    pcVar26[0x48] = '\0';
    pfVar17[-2].max_writer_lock_prob = 0x1144e3;
    fVar6 = fdb_kvs_open_default
                      (pfVar2,(fdb_kvs_handle **)(pcVar26 + 0x30),
                       (fdb_kvs_config *)&pfVar17[-2].enable_background_compactor);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001146a5;
    in_RCX = (fdb_config *)&pfVar17[-2].enable_background_compactor;
    pfVar17[-2].max_writer_lock_prob = 0x114504;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfVar17[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar26 + 0x38),"main",(fdb_kvs_config *)in_RCX);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001146aa;
    in_RCX = (fdb_config *)&pfVar17[-2].enable_background_compactor;
    pfVar17[-2].max_writer_lock_prob = 0x114525;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfVar17[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar26 + 0x40),"back",(fdb_kvs_config *)in_RCX);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001146af;
    pfVar17[-2].max_writer_lock_prob = 0x11453f;
    fVar6 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfVar17[-2].num_compactor_threads,
                       (fdb_kvs_handle **)(pcVar26 + 8),
                       (fdb_kvs_config *)&pfVar17[-2].enable_background_compactor);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001146b4;
    in_RCX = (fdb_config *)&pfVar17[-2].enable_background_compactor;
    pfVar17[-2].max_writer_lock_prob = 0x114560;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfVar17[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar26 + 0x10),"main",(fdb_kvs_config *)in_RCX);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001146b9;
    in_RCX = (fdb_config *)&pfVar17[-2].enable_background_compactor;
    pfVar17[-2].max_writer_lock_prob = 0x114581;
    fVar6 = fdb_kvs_open((fdb_file_handle *)pfVar17[-2].num_compactor_threads,
                         (fdb_kvs_handle **)(pcVar26 + 0x18),"back",(fdb_kvs_config *)in_RCX);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001146be;
    pfVar17[-2].max_writer_lock_prob = 0x1145a1;
    printf("Creating %d writers+readers over %d docs..\n",1,2000);
    unaff_R12 = (fdb_config *)(pcVar26 + 0x28);
    lVar15 = 8;
    pcVar27 = multi_thread_fhandle_share;
    do {
      LOCK();
      unaff_R12->durability_opt = '\0';
      UNLOCK();
      pfVar17[-2].max_writer_lock_prob = 0x1145cc;
      in_RCX = unaff_R12;
      pthread_create((pthread_t *)(&(pfVar9->kvs_config).create_if_missing + lVar15),
                     (pthread_attr_t *)0x0,multi_thread_fhandle_share,unaff_R12);
      lVar15 = lVar15 + -8;
      unaff_R12 = (fdb_config *)&unaff_R12[-1].num_keeping_headers;
    } while (lVar15 != -8);
    pfVar2 = *(fdb_file_handle **)&pfVar9->kvs_config;
    pfVar17[-2].max_writer_lock_prob = 0x1145e5;
    pthread_join((pthread_t)pfVar2,(void **)puVar10);
    pfVar17[-2].max_writer_lock_prob = 0x1145f5;
    printf("Writer %d done\n",0);
    LOCK();
    pcVar26[0x49] = '\x01';
    UNLOCK();
    __th = (pfVar9->kvs_config).custom_cmp;
    pfVar17[-2].max_writer_lock_prob = 0x11460b;
    pthread_join((pthread_t)__th,(void **)(puVar10 + 8));
    pfVar2 = *(fdb_file_handle **)pcVar26;
    pfVar17[-2].max_writer_lock_prob = 0x114613;
    fVar6 = fdb_close(pfVar2);
    puVar25 = (uint64_t *)0xfffffffffffffff8;
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfVar17[-2].max_writer_lock_prob = 0x114623;
      free(pfVar9);
      pfVar17[-2].max_writer_lock_prob = 0x11462b;
      free(pcVar26);
      pfVar17[-2].max_writer_lock_prob = 0x114633;
      free(puVar10);
      pfVar17[-2].max_writer_lock_prob = 0x114638;
      fdb_shutdown();
      pcVar26 = "%s PASSED\n";
      if (multi_thread_fhandle_share(void*)::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      pfVar17[-2].max_writer_lock_prob = 0x114669;
      fprintf(_stderr,pcVar26,"multi thread file handle share test");
      return (void *)0x0;
    }
  }
  else {
LAB_001146a0:
    pfVar17[-2].max_writer_lock_prob = 0x1146a5;
    multi_thread_fhandle_share();
    puVar20 = puVar19;
LAB_001146a5:
    pfVar17[-2].max_writer_lock_prob = 0x1146aa;
    multi_thread_fhandle_share();
    puVar21 = puVar20;
LAB_001146aa:
    pfVar17[-2].max_writer_lock_prob = 0x1146af;
    multi_thread_fhandle_share();
    puVar22 = puVar21;
LAB_001146af:
    pfVar17[-2].max_writer_lock_prob = 0x1146b4;
    multi_thread_fhandle_share();
    puVar23 = puVar22;
LAB_001146b4:
    pfVar17[-2].max_writer_lock_prob = 0x1146b9;
    multi_thread_fhandle_share();
    puVar24 = puVar23;
LAB_001146b9:
    pfVar17[-2].max_writer_lock_prob = 0x1146be;
    multi_thread_fhandle_share();
    puVar25 = puVar24;
LAB_001146be:
    pfVar17[-2].max_writer_lock_prob = 0x1146c3;
    multi_thread_fhandle_share();
  }
  pfVar17[-2].max_writer_lock_prob = (size_t)incomplete_block_test;
  multi_thread_fhandle_share();
  pfVar17[-2].max_writer_lock_prob = (size_t)puVar25;
  pfVar17[-2].compaction_cb_ctx = puVar10;
  *(char **)&pfVar17[-2].compaction_cb_mask = pcVar26;
  pfVar17[-2].compaction_cb = pcVar27;
  *(fdb_config **)&pfVar17[-2].num_wal_partitions = unaff_R12;
  pfVar17[-2].prefetch_duration = (uint64_t)pfVar9;
  pfVar17[-7].min_block_reuse_filesize = 0x1146e8;
  gettimeofday((timeval *)&pfVar17[-6].buffercache_size,(__timezone_ptr_t)0x0);
  pfVar17[-7].min_block_reuse_filesize = 0x1146ed;
  memleak_start();
  pfVar17[-7].breakpad_minidump_dir = (char *)0x0;
  pfVar17[-7].min_block_reuse_filesize = 0x1146fe;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17[-7].min_block_reuse_filesize = 0x11470e;
  fdb_get_default_config();
  pfVar11 = (fdb_doc *)&pfVar17[-6].wal_flush_before_commit;
  pfVar17[-7].min_block_reuse_filesize = 0x11471b;
  fdb_get_default_kvs_config();
  pfVar17[-3].num_wal_partitions = 0;
  pfVar17[-3].num_bcache_partitions = 0;
  *(undefined4 *)&pfVar17[-3].field_0x54 = 0;
  pfVar17[-3].compaction_cb = (fdb_compaction_callback)0x400;
  *(undefined4 *)((long)&pfVar17[-3].compaction_cb_ctx + 4) = 1;
  *(undefined1 *)((long)&pfVar17[-3].max_writer_lock_prob + 7) = 0;
  pfVar28 = pfVar17 + -6;
  pfVar17[-7].min_block_reuse_filesize = 0x114749;
  fdb_open((fdb_file_handle **)pfVar28,"./dummy1",(fdb_config *)&pfVar17[-3].prefetch_duration);
  pfVar2 = *(fdb_file_handle **)pfVar28;
  ptr_handle = (char **)&pfVar17[-7].log_msg_level;
  pfVar17[-7].min_block_reuse_filesize = 0x11475c;
  fdb_kvs_open_default(pfVar2,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar11);
  pfVar17[-7].min_block_reuse_filesize = 0x114772;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)*ptr_handle,logCallbackFunc,"incomplete_block_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_config *)0x0;
    uVar14 = 0;
    do {
      pfVar17[-7].min_block_reuse_filesize = 0x11479a;
      sprintf(&pfVar17[-4].multi_kv_instances,"key%d",uVar14 & 0xffffffff);
      pfVar17[-7].min_block_reuse_filesize = 0x1147b2;
      sprintf((char *)&pfVar17[-5].compactor_sleep_duration,"meta%d",uVar14 & 0xffffffff);
      pfVar17[-7].min_block_reuse_filesize = 0x1147c7;
      sprintf((char *)&pfVar17[-6].compaction_minimum_filesize,"body%d",uVar14 & 0xffffffff);
      pfVar28 = (fdb_config *)((long)pfVar17 + (long)unaff_R12 + -0x5e0);
      pfVar17[-7].min_block_reuse_filesize = 0x1147d7;
      sVar8 = strlen(&pfVar17[-4].multi_kv_instances);
      puVar25 = &pfVar17[-5].compactor_sleep_duration;
      pfVar17[-7].min_block_reuse_filesize = 0x1147ea;
      pfVar11 = (fdb_doc *)strlen((char *)puVar25);
      pfVar17[-7].min_block_reuse_filesize = 0x1147f7;
      sVar12 = strlen((char *)&pfVar17[-6].compaction_minimum_filesize);
      pfVar17[-7].max_block_reusing_cycle = sVar12;
      pfVar17[-7].min_block_reuse_filesize = 0x114819;
      fdb_doc_create((fdb_doc **)pfVar28,&pfVar17[-4].multi_kv_instances,sVar8,puVar25,
                     (size_t)pfVar11,&pfVar17[-6].compaction_minimum_filesize,
                     pfVar17[-7].max_block_reusing_cycle);
      doc = *(fdb_doc **)((long)pfVar17 + uVar14 * 8 + -0x5e0);
      pfVar17[-7].min_block_reuse_filesize = 0x114828;
      fdb_set((fdb_kvs_handle *)pfVar17[-7].log_msg_level,doc);
      uVar14 = uVar14 + 1;
      unaff_R12 = (fdb_config *)((long)unaff_R12 + 8);
    } while (uVar14 == 1);
    pcVar27 = (code *)0x0;
    ptr_handle = &pfVar17[-7].breakpad_minidump_dir;
    while( true ) {
      psVar3 = *(size_t **)((long)pfVar17 + (long)pcVar27 * 8 + -0x5e0);
      keylen = *psVar3;
      pvVar13 = (void *)psVar3[4];
      pfVar17[-7].max_block_reusing_cycle = 0;
      in_RCX = (fdb_config *)0x0;
      pfVar17[-7].min_block_reuse_filesize = 0x114865;
      fdb_doc_create((fdb_doc **)ptr_handle,pvVar13,keylen,(void *)0x0,0,(void *)0x0,
                     pfVar17[-7].max_block_reusing_cycle);
      pfVar17[-7].min_block_reuse_filesize = 0x114874;
      fVar6 = fdb_get((fdb_kvs_handle *)pfVar17[-7].log_msg_level,
                      (fdb_doc *)pfVar17[-7].breakpad_minidump_dir);
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      pfVar11 = (fdb_doc *)pfVar17[-7].breakpad_minidump_dir;
      sVar8 = pfVar11->metalen;
      pfVar28 = (fdb_config *)pfVar11->meta;
      puVar25 = *(uint64_t **)((long)pfVar17 + (long)pcVar27 * 8 + -0x5e0);
      unaff_R12 = (fdb_config *)puVar25[7];
      pfVar17[-7].min_block_reuse_filesize = 0x11489d;
      iVar7 = bcmp(pfVar28,unaff_R12,sVar8);
      if (iVar7 != 0) goto LAB_0011495d;
      sVar8 = pfVar11->bodylen;
      pfVar28 = (fdb_config *)pfVar11->body;
      unaff_R12 = (fdb_config *)puVar25[8];
      pfVar17[-7].min_block_reuse_filesize = 0x1148bc;
      iVar7 = bcmp(pfVar28,unaff_R12,sVar8);
      if (iVar7 != 0) goto LAB_00114968;
      pfVar17[-7].min_block_reuse_filesize = 0x1148cc;
      fdb_doc_free(pfVar11);
      pfVar17[-7].breakpad_minidump_dir = (char *)0x0;
      pcVar27 = (code *)((long)&((fdb_config *)pcVar27)->chunksize + 1);
      if ((fdb_config *)pcVar27 != (fdb_config *)0x1) {
        pfVar17[-7].min_block_reuse_filesize = 0x1148ec;
        fdb_kvs_close((fdb_kvs_handle *)pfVar17[-7].log_msg_level);
        pfVar2 = *(fdb_file_handle **)(pfVar17 + -6);
        pfVar17[-7].min_block_reuse_filesize = 0x1148f6;
        fdb_close(pfVar2);
        lVar15 = 0;
        do {
          pfVar11 = *(fdb_doc **)((long)pfVar17 + lVar15 * 8 + -0x5e0);
          pfVar17[-7].min_block_reuse_filesize = 0x114902;
          fdb_doc_free(pfVar11);
          lVar15 = lVar15 + 1;
        } while (lVar15 == 1);
        pfVar17[-7].min_block_reuse_filesize = 0x114910;
        fdb_shutdown();
        pfVar17[-7].min_block_reuse_filesize = 0x114915;
        memleak_end();
        pcVar26 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar26 = "%s FAILED\n";
        }
        pfVar17[-7].min_block_reuse_filesize = 0x114946;
        iVar7 = fprintf(_stderr,pcVar26,"incomplete block test");
        return (void *)CONCAT44(extraout_var,iVar7);
      }
    }
    pfVar17[-7].min_block_reuse_filesize = 0x11495d;
    incomplete_block_test();
LAB_0011495d:
    pfVar17[-7].min_block_reuse_filesize = 0x114968;
    incomplete_block_test();
LAB_00114968:
    pfVar17[-7].min_block_reuse_filesize = 0x114973;
    incomplete_block_test();
  }
  pfVar17[-7].min_block_reuse_filesize = (uint64_t)custom_compare_primitive_test;
  incomplete_block_test();
  pfVar17[-7].min_block_reuse_filesize = (uint64_t)puVar25;
  pfVar17[-7].block_reusing_threshold = (size_t)pfVar28;
  *(fdb_doc **)(pfVar17[-7].encryption_key.bytes + 0x1c) = pfVar11;
  *(code **)(pfVar17[-7].encryption_key.bytes + 0x14) = pcVar27;
  *(fdb_config **)(pfVar17[-7].encryption_key.bytes + 0xc) = unaff_R12;
  *(char ***)(pfVar17[-7].encryption_key.bytes + 4) = ptr_handle;
  uVar14 = 0;
  pfVar17[-0xb].block_reusing_threshold = 0x114997;
  gettimeofday((timeval *)(pfVar17 + -10),(__timezone_ptr_t)0x0);
  pfVar17[-0xb].block_reusing_threshold = 0x11499c;
  memleak_start();
  pfVar17[-0xb].num_keeping_headers = 0;
  pfVar17[-0xb].block_reusing_threshold = 0x1149ad;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17[-0xb].block_reusing_threshold = 0x1149bd;
  fdb_get_default_config();
  pfVar17[-0xb].block_reusing_threshold = 0x1149ca;
  fdb_get_default_kvs_config();
  pfVar17[-9].encryption_key.algorithm = 0;
  pfVar17[-9].encryption_key.bytes[0] = '\0';
  pfVar17[-9].encryption_key.bytes[1] = '\0';
  pfVar17[-9].encryption_key.bytes[2] = '\0';
  pfVar17[-9].encryption_key.bytes[3] = '\0';
  pfVar28 = pfVar17 + -9;
  (pfVar28->encryption_key).bytes[4] = '\0';
  (pfVar28->encryption_key).bytes[5] = '\x04';
  (pfVar28->encryption_key).bytes[6] = '\0';
  (pfVar28->encryption_key).bytes[7] = '\0';
  (pfVar28->encryption_key).bytes[8] = '\0';
  (pfVar28->encryption_key).bytes[9] = '\0';
  (pfVar28->encryption_key).bytes[10] = '\0';
  (pfVar28->encryption_key).bytes[0xb] = '\0';
  pfVar28 = pfVar17 + -9;
  (pfVar28->encryption_key).bytes[0x18] = '\x01';
  (pfVar28->encryption_key).bytes[0x19] = '\0';
  (pfVar28->encryption_key).bytes[0x1a] = '\0';
  (pfVar28->encryption_key).bytes[0x1b] = '\0';
  pfVar17[-9].field_0xb7 = 0;
  *(undefined1 *)&pfVar17[-9].max_block_reusing_cycle = 1;
  *(code **)&pfVar17[-10].wal_flush_before_commit = _cmp_double;
  pfVar17[-0xb].block_reusing_threshold = 0x114a0a;
  fdb_open((fdb_file_handle **)&pfVar17[-0xb].num_blocks_readahead,"./dummy1",
           (fdb_config *)&pfVar17[-9].num_bgflusher_threads);
  pfVar17[-0xb].block_reusing_threshold = 0x114a1e;
  fdb_kvs_open_default
            (*(fdb_file_handle **)&pfVar17[-0xb].num_blocks_readahead,
             (fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file,
             (fdb_kvs_config *)&pfVar17[-10].wal_threshold);
  pfVar9 = *(fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file;
  pcVar27 = logCallbackFunc;
  pfVar17[-0xb].block_reusing_threshold = 0x114a34;
  fVar6 = fdb_set_log_callback(pfVar9,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    puVar25 = (uint64_t *)&pfVar17[-10].compaction_buf_maxsize;
    psVar3 = &pfVar17[-8].num_bgflusher_threads;
    lVar15 = 0;
    do {
      dVar31 = 10000.0 / (double)(int)lVar15;
      pfVar17[-10].num_compactor_threads = (size_t)dVar31;
      pfVar17[-0xb].max_block_reusing_cycle = (size_t)dVar31;
      pfVar17[-0xb].block_reusing_threshold = 0x114a8f;
      sprintf((char *)psVar3,"value: %d, %f",SUB84(dVar31,0),uVar14);
      pfVar17[-0xb].block_reusing_threshold = 0x114a97;
      sVar8 = strlen((char *)psVar3);
      pfVar17[-0xb].min_block_reuse_filesize = sVar8 + 1;
      pfVar17[-0xb].block_reusing_threshold = 0x114ab6;
      fdb_doc_create((fdb_doc **)puVar25,&pfVar17[-10].num_compactor_threads,8,(void *)0x0,0,psVar3,
                     pfVar17[-0xb].min_block_reuse_filesize);
      pfVar11 = (fdb_doc *)*puVar25;
      pfVar17[-0xb].block_reusing_threshold = 0x114ac3;
      fdb_set(*(fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file,pfVar11);
      lVar15 = lVar15 + 0xb;
      uVar14 = (ulong)((int)uVar14 + 1);
      puVar25 = puVar25 + 1;
    } while (lVar15 != 0x6e);
    psVar3 = &pfVar17[-0xb].log_msg_level;
    *psVar3 = pfVar17[-0xb].max_block_reusing_cycle;
    *(undefined4 *)&pfVar17[-0xb].min_block_reuse_filesize = 0;
    in_RCX = (fdb_config *)0x0;
    pfVar17[-0xb].block_reusing_threshold = 0x114b02;
    fdb_iterator_init(*(fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file,
                      (fdb_iterator **)&pfVar17[-0xb].breakpad_minidump_dir,(void *)0x0,0,
                      (void *)0x0,0,(fdb_iterator_opt_t)pfVar17[-0xb].min_block_reuse_filesize);
    uVar29 = 0;
    uVar30 = 0xbff00000;
    do {
      pfVar17[-0xb].max_block_reusing_cycle = CONCAT44(uVar30,uVar29);
      pfVar9 = (fdb_kvs_handle *)pfVar17[-0xb].breakpad_minidump_dir;
      pfVar17[-0xb].block_reusing_threshold = 0x114b22;
      pcVar27 = (code *)&pfVar17[-0xb].num_keeping_headers;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfVar9,(fdb_doc **)&pfVar17[-0xb].num_keeping_headers
                              );
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_00114d7b:
        pfVar17[-0xb].block_reusing_threshold = 0x114d80;
        custom_compare_primitive_test();
        goto LAB_00114d80;
      }
      sVar8 = *(size_t *)pfVar17[-0xb].num_keeping_headers;
      pcVar27 = (code *)((size_t *)pfVar17[-0xb].num_keeping_headers)[4];
      pfVar17[-0xb].block_reusing_threshold = 0x114b3e;
      pfVar9 = (fdb_kvs_handle *)psVar3;
      memcpy(psVar3,pcVar27,sVar8);
      dVar31 = (double)pfVar17[-0xb].log_msg_level;
      if (dVar31 < (double)pfVar17[-0xb].max_block_reusing_cycle ||
          dVar31 == (double)pfVar17[-0xb].max_block_reusing_cycle) {
        pfVar17[-0xb].block_reusing_threshold = 0x114d7b;
        custom_compare_primitive_test();
        goto LAB_00114d7b;
      }
      pfVar17[-0xb].max_block_reusing_cycle = (size_t)dVar31;
      pfVar17[-0xb].block_reusing_threshold = 0x114b60;
      fdb_doc_free((fdb_doc *)pfVar17[-0xb].num_keeping_headers);
      pfVar17[-0xb].num_keeping_headers = 0;
      pfVar17[-0xb].block_reusing_threshold = 0x114b73;
      fVar6 = fdb_iterator_next((fdb_iterator *)pfVar17[-0xb].breakpad_minidump_dir);
      uVar29 = (undefined4)pfVar17[-0xb].max_block_reusing_cycle;
      uVar30 = (undefined4)(pfVar17[-0xb].max_block_reusing_cycle >> 0x20);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    pfVar17[-0xb].block_reusing_threshold = 0x114b8b;
    fdb_iterator_close((fdb_iterator *)pfVar17[-0xb].breakpad_minidump_dir);
    pfVar17[-0xb].block_reusing_threshold = 0x114b9a;
    fdb_commit(*(fdb_file_handle **)&pfVar17[-0xb].num_blocks_readahead,'\x01');
    *(undefined4 *)&pfVar17[-0xb].min_block_reuse_filesize = 0;
    in_RCX = (fdb_config *)0x0;
    pfVar17[-0xb].block_reusing_threshold = 0x114bb8;
    fdb_iterator_init(*(fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file,
                      (fdb_iterator **)&pfVar17[-0xb].breakpad_minidump_dir,(void *)0x0,0,
                      (void *)0x0,0,(fdb_iterator_opt_t)pfVar17[-0xb].min_block_reuse_filesize);
    uVar29 = 0;
    uVar30 = 0xbff00000;
    do {
      pfVar17[-0xb].max_block_reusing_cycle = CONCAT44(uVar30,uVar29);
      pfVar9 = (fdb_kvs_handle *)pfVar17[-0xb].breakpad_minidump_dir;
      pfVar17[-0xb].block_reusing_threshold = 0x114bdd;
      pcVar27 = (code *)&pfVar17[-0xb].num_keeping_headers;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfVar9,(fdb_doc **)&pfVar17[-0xb].num_keeping_headers
                              );
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00114d85;
      sVar8 = *(size_t *)pfVar17[-0xb].num_keeping_headers;
      pcVar27 = (code *)((size_t *)pfVar17[-0xb].num_keeping_headers)[4];
      pfVar17[-0xb].block_reusing_threshold = 0x114bf9;
      pfVar9 = (fdb_kvs_handle *)&pfVar17[-0xb].log_msg_level;
      memcpy(&pfVar17[-0xb].log_msg_level,pcVar27,sVar8);
      dVar31 = (double)pfVar17[-0xb].log_msg_level;
      if (dVar31 < (double)pfVar17[-0xb].max_block_reusing_cycle ||
          dVar31 == (double)pfVar17[-0xb].max_block_reusing_cycle) goto LAB_00114d80;
      pfVar17[-0xb].max_block_reusing_cycle = (size_t)dVar31;
      pfVar17[-0xb].block_reusing_threshold = 0x114c1b;
      fdb_doc_free((fdb_doc *)pfVar17[-0xb].num_keeping_headers);
      pfVar17[-0xb].num_keeping_headers = 0;
      pfVar17[-0xb].block_reusing_threshold = 0x114c2e;
      fVar6 = fdb_iterator_next((fdb_iterator *)pfVar17[-0xb].breakpad_minidump_dir);
      uVar29 = (undefined4)pfVar17[-0xb].max_block_reusing_cycle;
      uVar30 = (undefined4)(pfVar17[-0xb].max_block_reusing_cycle >> 0x20);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    pfVar17[-0xb].block_reusing_threshold = 0x114c46;
    fdb_iterator_close((fdb_iterator *)pfVar17[-0xb].breakpad_minidump_dir);
    pfVar17[-0xb].block_reusing_threshold = 0x114c57;
    fdb_compact(*(fdb_file_handle **)&pfVar17[-0xb].num_blocks_readahead,"./dummy2");
    *(undefined4 *)&pfVar17[-0xb].min_block_reuse_filesize = 0;
    in_RCX = (fdb_config *)0x0;
    pfVar17[-0xb].block_reusing_threshold = 0x114c75;
    fdb_iterator_init(*(fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file,
                      (fdb_iterator **)&pfVar17[-0xb].breakpad_minidump_dir,(void *)0x0,0,
                      (void *)0x0,0,(fdb_iterator_opt_t)pfVar17[-0xb].min_block_reuse_filesize);
    uVar29 = 0;
    uVar30 = 0xbff00000;
    while( true ) {
      pfVar17[-0xb].max_block_reusing_cycle = CONCAT44(uVar30,uVar29);
      pfVar9 = (fdb_kvs_handle *)pfVar17[-0xb].breakpad_minidump_dir;
      pfVar17[-0xb].block_reusing_threshold = 0x114c9a;
      pcVar27 = (code *)&pfVar17[-0xb].num_keeping_headers;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfVar9,(fdb_doc **)&pfVar17[-0xb].num_keeping_headers
                              );
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      sVar8 = *(size_t *)pfVar17[-0xb].num_keeping_headers;
      pcVar27 = (code *)((size_t *)pfVar17[-0xb].num_keeping_headers)[4];
      pfVar17[-0xb].block_reusing_threshold = 0x114cb6;
      pfVar9 = (fdb_kvs_handle *)&pfVar17[-0xb].log_msg_level;
      memcpy(&pfVar17[-0xb].log_msg_level,pcVar27,sVar8);
      dVar31 = (double)pfVar17[-0xb].log_msg_level;
      if (dVar31 < (double)pfVar17[-0xb].max_block_reusing_cycle ||
          dVar31 == (double)pfVar17[-0xb].max_block_reusing_cycle) goto LAB_00114d8a;
      pfVar17[-0xb].max_block_reusing_cycle = (size_t)dVar31;
      pfVar17[-0xb].block_reusing_threshold = 0x114cd8;
      fdb_doc_free((fdb_doc *)pfVar17[-0xb].num_keeping_headers);
      pfVar17[-0xb].num_keeping_headers = 0;
      pfVar17[-0xb].block_reusing_threshold = 0x114ceb;
      fVar6 = fdb_iterator_next((fdb_iterator *)pfVar17[-0xb].breakpad_minidump_dir);
      uVar29 = (undefined4)pfVar17[-0xb].max_block_reusing_cycle;
      uVar30 = (undefined4)(pfVar17[-0xb].max_block_reusing_cycle >> 0x20);
      if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar17[-0xb].block_reusing_threshold = 0x114d00;
        fdb_iterator_close((fdb_iterator *)pfVar17[-0xb].breakpad_minidump_dir);
        pfVar17[-0xb].block_reusing_threshold = 0x114d0a;
        fdb_kvs_close(*(fdb_kvs_handle **)&pfVar17[-0xb].do_not_move_to_compacted_file);
        pfVar17[-0xb].block_reusing_threshold = 0x114d14;
        fdb_close(*(fdb_file_handle **)&pfVar17[-0xb].num_blocks_readahead);
        lVar15 = 0;
        do {
          pfVar11 = *(fdb_doc **)((long)pfVar17 + lVar15 * 8 + -0x988);
          pfVar17[-0xb].block_reusing_threshold = 0x114d20;
          fdb_doc_free(pfVar11);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 10);
        pfVar17[-0xb].block_reusing_threshold = 0x114d2e;
        fdb_shutdown();
        pfVar17[-0xb].block_reusing_threshold = 0x114d33;
        memleak_end();
        pcVar26 = "%s PASSED\n";
        if (custom_compare_primitive_test()::__test_pass != '\0') {
          pcVar26 = "%s FAILED\n";
        }
        pfVar17[-0xb].block_reusing_threshold = 0x114d64;
        iVar7 = fprintf(_stderr,pcVar26,"custom compare function for primitive key test");
        return (void *)CONCAT44(extraout_var_00,iVar7);
      }
    }
LAB_00114d8f:
    pfVar17[-0xb].block_reusing_threshold = 0x114d94;
    custom_compare_primitive_test();
  }
  pfVar17[-0xb].block_reusing_threshold = (size_t)_cmp_double;
  custom_compare_primitive_test();
  pvVar13 = (void *)0xffffffff;
  if (pcVar27 != (code *)0x0) {
    if (in_RCX == (fdb_config *)0x0) {
      return (void *)0x1;
    }
    if (*extraout_RDX <= *(double *)&pfVar9->kvs_config) {
      pvVar13 = (void *)(ulong)(*extraout_RDX < *(double *)&pfVar9->kvs_config);
    }
  }
  return pvVar13;
}

Assistant:

void *multi_thread_client_shutdown(void *args)
{

    TEST_INIT();

    int i, r;
    int nclients;
    fdb_file_handle *tdbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;
        nclients = 2;
        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            thread_create(&tid[i], multi_thread_client_shutdown, (void *)&i);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // threads enter here //

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    // open/close db
    status = fdb_open(&tdbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(fdb_close(tdbfile) == FDB_RESULT_SUCCESS);

    // shutdown
    fdb_shutdown();
    thread_exit(0);
    return NULL;
}